

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# holding_property.cpp
# Opt level: O0

void __thiscall HoldingProperty_MoveFrom_Test::TestBody(HoldingProperty_MoveFrom_Test *this)

{
  bool bVar1;
  Movable *pMVar2;
  Movable *pMVar3;
  char *pcVar4;
  AssertHelper local_198;
  Message local_190;
  int local_188 [2];
  undefined1 local_180 [8];
  AssertionResult gtest_ar_7;
  Message local_168;
  int local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_6;
  Movable move_to3;
  Message local_138;
  int local_130 [2];
  undefined1 local_128 [8];
  AssertionResult gtest_ar_5;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_4;
  Movable move_to2;
  Message local_e0;
  int local_d8 [2];
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_3;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_2;
  Movable move_to4;
  Message local_88;
  int local_80 [2];
  undefined1 local_78 [8];
  AssertionResult gtest_ar_1;
  Message local_60 [3];
  int local_44;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  int local_28;
  Movable move_to;
  int remembered_value;
  HoldingMovableType obj;
  HoldingProperty_MoveFrom_Test *this_local;
  
  obj._12_8_ = this;
  HoldingMovableType::HoldingMovableType((HoldingMovableType *)&move_to);
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&move_to);
  local_28 = Movable::getId(pMVar2);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&move_to);
  pMVar2 = (Movable *)((long)&gtest_ar.message_.ptr_ + 4);
  Movable::Movable(pMVar2,pMVar3);
  local_44 = Movable::getId(pMVar2);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_40,"remembered_value","move_to.getId()",&local_28,&local_44);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_60);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x21c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_80[1] = 0;
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&move_to);
  local_80[0] = Movable::getId(pMVar2);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_78,"0","obj.value1().getId()",local_80 + 1,local_80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x21d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff70,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff70);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
                         *)&obj);
  local_28 = Movable::getId(pMVar2);
  pMVar3 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
                         *)&obj);
  pMVar2 = (Movable *)((long)&gtest_ar_2.message_.ptr_ + 4);
  Movable::Movable(pMVar2,pMVar3);
  local_ac = Movable::getId(pMVar2);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_a8,"remembered_value","move_to4.getId()",&local_28,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x222,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  local_d8[1] = 0;
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
                         *)&obj);
  local_d8[0] = Movable::getId(pMVar2);
  testing::internal::CmpHelperNE<int,int>
            ((internal *)local_d0,"0","obj.ro_value().getId()",local_d8 + 1,local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(&local_e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x223,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff18,&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff18);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&move_to);
  local_28 = Movable::getId(pMVar2);
  pMVar3 = prop::detail::PropertyRealValueBase::operator_cast_to_Movable__
                     ((PropertyRealValueBase *)&move_to);
  pMVar2 = (Movable *)((long)&gtest_ar_4.message_.ptr_ + 4);
  Movable::Movable(pMVar2,pMVar3);
  local_104 = Movable::getId(pMVar2);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_100,"remembered_value","move_to2.getId()",&local_28,&local_104
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x229,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_110);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  local_130[1] = 0;
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_0UL,_prop::ReadWrite>,_Movable>
                         *)&move_to);
  local_130[0] = Movable::getId(pMVar2);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_128,"0",(int *)"obj.value1().getId()",local_130 + 1,local_130);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffec0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x22a,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffec0,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffec0);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
                         *)&obj);
  local_28 = Movable::getId(pMVar2);
  pMVar3 = prop::detail::PropertyRealValueBase::operator_cast_to_Movable__
                     ((PropertyRealValueBase *)&obj);
  pMVar2 = (Movable *)((long)&gtest_ar_6.message_.ptr_ + 4);
  Movable::Movable(pMVar2,pMVar3);
  local_15c = Movable::getId(pMVar2);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_158,"remembered_value","move_to3.getId()",&local_28,&local_15c
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x22e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_188[1] = 0;
  pMVar2 = prop::detail::
           PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
           ::operator()((PropertyRealValueBase<prop::HoldingProperty<HoldingMovableType,_Movable,_2UL,_prop::ReadOnly>,_Movable>
                         *)&obj);
  local_188[0] = Movable::getId(pMVar2);
  testing::internal::EqHelper<true>::Compare<int,int>
            ((char *)local_180,"0",(int *)"obj.ro_value().getId()",local_188 + 1,local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JohnJocoo[P]cpp_properties/test/holding_property.cpp"
               ,0x22f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  return;
}

Assistant:

TEST(HoldingProperty, MoveFrom)
{
  HoldingMovableType obj;

  // can't move from returned value
  auto remembered_value = obj.value1().getId();
  Movable move_to = std::move( obj.value1() );
  EXPECT_NE( remembered_value, move_to.getId() );
  EXPECT_NE( 0, obj.value1().getId() );
  
  // can't move from returned value
  remembered_value = obj.ro_value().getId();
  Movable move_to4 = std::move( obj.ro_value() );
  EXPECT_NE( remembered_value, move_to4.getId() );
  EXPECT_NE( 0, obj.ro_value().getId() );
  
#if MOVE_CAST_SUPPORTED

  remembered_value = obj.value1().getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_EQ( remembered_value, move_to2.getId() );
  EXPECT_EQ( 0, obj.value1().getId() );
  
  remembered_value = obj.ro_value().getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_EQ( remembered_value, move_to3.getId() );
  EXPECT_EQ( 0, obj.ro_value().getId() );

#else

  remembered_value = obj.value1().getId();
  Movable move_to2 = std::move( obj.value1 );
  EXPECT_NE( remembered_value, move_to2.getId() );
  EXPECT_NE( 0, obj.value1().getId() );

  remembered_value = obj.ro_value().getId();
  Movable move_to3 = std::move( obj.ro_value );
  EXPECT_NE( remembered_value, move_to3.getId() );
  EXPECT_NE( 0, obj.ro_value().getId() );

#endif
}